

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerSync(Pager *pPager)

{
  int local_14;
  int rc;
  Pager *pPager_local;
  
  local_14 = 0;
  if (pPager->noSync == '\0') {
    local_14 = sqlite3OsSync(pPager->fd,(uint)pPager->syncFlags);
  }
  else if ((pPager->fd->pMethods != (sqlite3_io_methods *)0x0) &&
          (local_14 = sqlite3OsFileControl(pPager->fd,8,(void *)0x0), local_14 == 0xc)) {
    local_14 = 0;
  }
  return local_14;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerSync(Pager *pPager){
  int rc = SQLITE_OK;
  if( !pPager->noSync ){
    assert( !MEMDB );
    rc = sqlite3OsSync(pPager->fd, pPager->syncFlags);
  }else if( isOpen(pPager->fd) ){
    assert( !MEMDB );
    rc = sqlite3OsFileControl(pPager->fd, SQLITE_FCNTL_SYNC_OMITTED, 0);
    if( rc==SQLITE_NOTFOUND ){
      rc = SQLITE_OK;
    }
  }
  return rc;
}